

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O1

void __thiscall OpenMD::AtomStamp::AtomStamp(AtomStamp *this,int index)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_50;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__AtomStamp_003059f0;
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_00303298;
  (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Type).super_ParameterBase.keyword_.field_2;
  (this->Type).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Type).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Type).super_ParameterBase.optional_ = false;
  (this->Type).super_ParameterBase.defaultValue_ = false;
  (this->Type).super_ParameterBase.empty_ = true;
  (this->Type).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_00303308;
  (this->Type).data_._M_dataplus._M_p = (pointer)&(this->Type).data_.field_2;
  (this->Type).data_._M_string_length = 0;
  (this->Type).data_.field_2._M_local_buf[0] = '\0';
  this->havePos_ = false;
  this->haveOrt_ = false;
  this->hasOverride_ = false;
  (this->position_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->position_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->position_).super_Vector<double,_3U>.data_[2] = 0.0;
  (this->orientation_).super_Vector<double,_3U>.data_[0] = 0.0;
  (this->orientation_).super_Vector<double,_3U>.data_[1] = 0.0;
  (this->orientation_).super_Vector<double,_3U>.data_[2] = 0.0;
  this->index_ = index;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  p_Var1 = &(this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_50.first.field_2;
  local_50.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"type","");
  std::__cxx11::string::_M_assign((string *)&(this->Type).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"type","");
  if (local_70 == &local_60) {
    local_50.first.field_2._8_8_ = local_60._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_50.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_50.first._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70 = &local_60;
  local_50.second = &(this->Type).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

AtomStamp::AtomStamp(int index) :
      havePos_(false), haveOrt_(false), hasOverride_(false), index_(index) {
    DefineParameter(Type, "type");
  }